

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_nonblock.cc
# Opt level: O3

int set_nonblock(int fd)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = fcntl(fd,3,0);
  uVar1 = uVar2 | 0x800;
  if (uVar2 == 0xffffffff) {
    uVar1 = 0x800;
  }
  iVar3 = fcntl(fd,4,(ulong)uVar1);
  return iVar3;
}

Assistant:

int set_nonblock(int fd)
{
        int flags;
#if defined(O_NONBLOCK)
        if (-1 == (flags = fcntl(fd, F_GETFL, 0)))
                flags = 0;
        return fcntl(fd, F_SETFL, flags | O_NONBLOCK);
#else
        flags = 1;
        return ioctl(fd, FIOBIO, &flags);
#endif
}